

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRecordRepresentation0.cpp
# Opt level: O1

void __thiscall
DIS::GridAxisRecordRepresentation0::unmarshal
          (GridAxisRecordRepresentation0 *this,DataStream *dataStream)

{
  undefined1 *d;
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  undefined8 in_RAX;
  uint uVar3;
  uint8_t x;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  GridAxisRecord::unmarshal(&this->super_GridAxisRecord,dataStream);
  d = &(this->super_GridAxisRecord).field_0xc;
  DataStream::operator>>(dataStream,(unsigned_short *)d);
  puVar2 = (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (*(short *)d != 0) {
    uVar3 = 0;
    do {
      DataStream::operator>>(dataStream,(uchar *)((long)&uStack_38 + 7));
      __position._M_current =
           (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_dataValues).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->_dataValues,
                   __position,(uchar *)((long)&uStack_38 + 7));
      }
      else {
        *__position._M_current = uStack_38._7_1_;
        ppuVar1 = &(this->_dataValues).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ushort *)d);
  }
  return;
}

Assistant:

void GridAxisRecordRepresentation0::unmarshal(DataStream &dataStream) {
  GridAxisRecord::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _numberOfBytes;

  _dataValues.clear();
  for (auto idx = 0; idx < _numberOfBytes; ++idx) {
    uint8_t x;
    dataStream >> x;
    _dataValues.push_back(x);
  }
}